

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomString::read(DomString *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_00;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_00 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  lVar5 = 0;
  pQVar4 = local_50.ptr;
  while( true ) {
    if (local_50.size * 0x68 == lVar5) break;
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"notr",4);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeNotr(this,(QString *)&local_80);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"comment",7);
      local_98.a.m_size = local_80.size;
      local_98.a.m_data = (char *)local_80.ptr;
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (bVar1) {
        local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
        local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
        QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
        setAttributeComment(this,(QString *)&local_80);
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"extracomment",0xc);
        local_98.a.m_size = local_80.size;
        local_98.a.m_data = (char *)local_80.ptr;
        bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        if (bVar1) {
          local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
          local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
          QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
          setAttributeExtraComment(this,(QString *)&local_80);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"id",2);
          local_98.a.m_size = local_80.size;
          local_98.a.m_data = (char *)local_80.ptr;
          bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
          if (bVar1) {
            local_98.a.m_data = *(char **)(local_50.ptr + lVar5 + 0x50);
            local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x58);
            QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
            setAttributeId(this,(QString *)&local_80);
          }
          else {
            local_98.a.m_size = 0x15;
            local_98.a.m_data = "Unexpected attribute ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_80,&local_98);
            QXmlStreamReader::raiseError((QString *)this_00);
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar4 = pQVar4 + 0x68;
    lVar5 = lVar5 + 0x68;
  }
LAB_0015f65f:
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_00);
      if (bVar1) goto LAB_0015f716;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      local_98.a.m_size = 0x13;
      local_98.a.m_data = "Unexpected element ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_00);
LAB_0015f709:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    if (iVar3 == 6) {
      cVar2 = QXmlStreamReader::isWhitespace();
      if (cVar2 == '\0') {
        QVar6 = (QLatin1String)QXmlStreamReader::text();
        local_98.a = QVar6;
        QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
        QString::append(&this->m_text);
        goto LAB_0015f709;
      }
      goto LAB_0015f65f;
    }
    if (iVar3 == 5) {
LAB_0015f716:
      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  } while( true );
}

Assistant:

void DomString::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"notr"_s) {
            setAttributeNotr(attribute.value().toString());
            continue;
        }
        if (name == u"comment"_s) {
            setAttributeComment(attribute.value().toString());
            continue;
        }
        if (name == u"extracomment"_s) {
            setAttributeExtraComment(attribute.value().toString());
            continue;
        }
        if (name == u"id"_s) {
            setAttributeId(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        case QXmlStreamReader::Characters :
            if (!reader.isWhitespace())
                m_text.append(reader.text().toString());
            break;
        default :
            break;
        }
    }
}